

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_update_servers.c
# Opt level: O0

ares_status_t set_servers_csv(ares_channel_t *channel,char *_csv)

{
  size_t sVar1;
  ares_llist_t *local_30;
  ares_llist_t *slist;
  char *pcStack_20;
  ares_status_t status;
  char *_csv_local;
  ares_channel_t *channel_local;
  
  local_30 = (ares_llist_t *)0x0;
  if (channel == (ares_channel_t *)0x0) {
    channel_local._4_4_ = ARES_ENODATA;
  }
  else {
    pcStack_20 = _csv;
    _csv_local = (char *)channel;
    sVar1 = ares_strlen(_csv);
    if (sVar1 == 0) {
      ares_channel_lock((ares_channel_t *)_csv_local);
      slist._4_4_ = ares_servers_update((ares_channel_t *)_csv_local,(ares_llist_t *)0x0,ARES_TRUE);
      ares_channel_unlock((ares_channel_t *)_csv_local);
      channel_local._4_4_ = slist._4_4_;
    }
    else {
      slist._4_4_ = ares_sconfig_append_fromstr
                              ((ares_channel_t *)_csv_local,&local_30,pcStack_20,ARES_FALSE);
      if (slist._4_4_ == ARES_SUCCESS) {
        ares_channel_lock((ares_channel_t *)_csv_local);
        slist._4_4_ = ares_servers_update((ares_channel_t *)_csv_local,local_30,ARES_TRUE);
        ares_channel_unlock((ares_channel_t *)_csv_local);
        ares_llist_destroy(local_30);
        channel_local._4_4_ = slist._4_4_;
      }
      else {
        ares_llist_destroy(local_30);
        channel_local._4_4_ = slist._4_4_;
      }
    }
  }
  return channel_local._4_4_;
}

Assistant:

static ares_status_t set_servers_csv(ares_channel_t *channel, const char *_csv)
{
  ares_status_t status;
  ares_llist_t *slist = NULL;

  if (channel == NULL) {
    return ARES_ENODATA;
  }

  if (ares_strlen(_csv) == 0) {
    /* blank all servers */
    ares_channel_lock(channel);
    status = ares_servers_update(channel, NULL, ARES_TRUE);
    ares_channel_unlock(channel);
    return status;
  }

  status = ares_sconfig_append_fromstr(channel, &slist, _csv, ARES_FALSE);
  if (status != ARES_SUCCESS) {
    ares_llist_destroy(slist);
    return status;
  }

  ares_channel_lock(channel);
  status = ares_servers_update(channel, slist, ARES_TRUE);
  ares_channel_unlock(channel);

  ares_llist_destroy(slist);

  return status;
}